

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPlugin.cpp
# Opt level: O2

NullTestPlugin * NullTestPlugin::instance(void)

{
  int iVar1;
  
  if (instance()::_instance == '\0') {
    iVar1 = __cxa_guard_acquire(&instance()::_instance);
    if (iVar1 != 0) {
      NullTestPlugin(&instance::_instance);
      __cxa_atexit(TestPlugin::~TestPlugin,&instance::_instance,&__dso_handle);
      __cxa_guard_release(&instance()::_instance);
    }
  }
  return &instance::_instance;
}

Assistant:

NullTestPlugin* NullTestPlugin::instance()
{
    static NullTestPlugin _instance;
    return &_instance;
}